

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O2

void __thiscall
HighsLinearSumBounds::updatedVarUpper
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient,
          double oldVarUpper)

{
  int *piVar1;
  double dVar2;
  HighsCDouble *this_00;
  double dVar3;
  double dVar4;
  
  dVar3 = oldVarUpper;
  if (this->implVarUpperSource[var] == sum) {
    dVar4 = this->varUpper[var];
  }
  else {
    dVar2 = this->implVarUpper[var];
    if (dVar2 <= oldVarUpper) {
      dVar3 = dVar2;
    }
    dVar4 = this->varUpper[var];
    if (dVar2 <= this->varUpper[var]) {
      dVar4 = dVar2;
    }
  }
  if (coefficient <= 0.0) {
    if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
      if (dVar3 < INFINITY) {
        HighsCDouble::operator-=
                  ((this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar3 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + -1;
      }
      if (dVar4 < INFINITY) {
        HighsCDouble::operator+=
                  ((this->sumLower).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar4 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumLower).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + 1;
      }
    }
    if (oldVarUpper < INFINITY) {
      HighsCDouble::operator-=
                ((this->sumLowerOrig).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start + sum,oldVarUpper * coefficient);
    }
    else {
      piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    dVar3 = this->varUpper[var];
    if (dVar3 < INFINITY) {
      this_00 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                ._M_impl.super__Vector_impl_data._M_start + sum;
      goto LAB_0035dfe5;
    }
    piVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + sum;
    *piVar1 = *piVar1 + 1;
  }
  else {
    if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
      if (dVar3 < INFINITY) {
        HighsCDouble::operator-=
                  ((this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar3 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + -1;
      }
      if (dVar4 < INFINITY) {
        HighsCDouble::operator+=
                  ((this->sumUpper).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                   _M_impl.super__Vector_impl_data._M_start + sum,dVar4 * coefficient);
      }
      else {
        piVar1 = (this->numInfSumUpper).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + sum;
        *piVar1 = *piVar1 + 1;
      }
    }
    if (oldVarUpper < INFINITY) {
      HighsCDouble::operator-=
                ((this->sumUpperOrig).
                 super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                 super__Vector_impl_data._M_start + sum,oldVarUpper * coefficient);
    }
    else {
      piVar1 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + sum;
      *piVar1 = *piVar1 + -1;
    }
    dVar3 = this->varUpper[var];
    if (dVar3 < INFINITY) {
      this_00 = (this->sumUpperOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                ._M_impl.super__Vector_impl_data._M_start + sum;
LAB_0035dfe5:
      HighsCDouble::operator+=(this_00,dVar3 * coefficient);
      return;
    }
    piVar1 = (this->numInfSumUpperOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + sum;
    *piVar1 = *piVar1 + 1;
  }
  return;
}

Assistant:

void HighsLinearSumBounds::updatedVarUpper(HighsInt sum, HighsInt var,
                                           double coefficient,
                                           double oldVarUpper) {
  double oldVUpper = implVarUpperSource[var] == sum
                         ? oldVarUpper
                         : std::min(implVarUpper[var], oldVarUpper);

  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (coefficient > 0) {
    if (vUpper != oldVUpper) {
      if (oldVUpper == kHighsInf)
        numInfSumUpper[sum] -= 1;
      else
        sumUpper[sum] -= oldVUpper * coefficient;

      if (vUpper == kHighsInf)
        numInfSumUpper[sum] += 1;
      else
        sumUpper[sum] += vUpper * coefficient;
    }
    if (oldVarUpper == kHighsInf)
      numInfSumUpperOrig[sum] -= 1;
    else
      sumUpperOrig[sum] -= oldVarUpper * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumUpperOrig[sum] += 1;
    else
      sumUpperOrig[sum] += varUpper[var] * coefficient;
  } else {
    if (vUpper != oldVUpper) {
      if (oldVUpper == kHighsInf)
        numInfSumLower[sum] -= 1;
      else
        sumLower[sum] -= oldVUpper * coefficient;

      if (vUpper == kHighsInf)
        numInfSumLower[sum] += 1;
      else
        sumLower[sum] += vUpper * coefficient;
    }
    if (oldVarUpper == kHighsInf)
      numInfSumLowerOrig[sum] -= 1;
    else
      sumLowerOrig[sum] -= oldVarUpper * coefficient;

    if (varUpper[var] == kHighsInf)
      numInfSumLowerOrig[sum] += 1;
    else
      sumLowerOrig[sum] += varUpper[var] * coefficient;
  }
}